

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,2,0,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  comm *comm_00;
  _Elt_pointer ppVar6;
  _Elt_pointer ppVar7;
  comm *comm_01;
  unsigned_long uVar8;
  _Elt_pointer ppVar9;
  pair<unsigned_long,_unsigned_long> *ppVar10;
  pair<unsigned_long,_unsigned_long> *ppVar11;
  pair<unsigned_long,_unsigned_long> *ppVar12;
  long *plVar13;
  pair<unsigned_long,_unsigned_long> *ppVar14;
  _Map_pointer pppVar15;
  pair<unsigned_long,_unsigned_long> *ppVar16;
  _Map_pointer pppVar17;
  _Map_pointer pppVar18;
  pair<unsigned_long,_unsigned_long> *ppVar19;
  unsigned_long uVar20;
  _Map_pointer pppVar21;
  ulong uVar22;
  pair<unsigned_long,_unsigned_long> *ppVar23;
  long lVar24;
  _Elt_pointer ppVar25;
  ulong uVar26;
  unsigned_long uVar27;
  unsigned_long uVar28;
  ulong *puVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar35;
  pointer puVar36;
  ulong uVar37;
  long lVar38;
  bool bVar39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_218;
  comm *local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1c0;
  pair<unsigned_long,_unsigned_long> *local_1b8;
  pair<unsigned_long,_unsigned_long> *ppStack_1b0;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_1a0;
  pair<unsigned_long,_unsigned_long> *local_198;
  pair<unsigned_long,_unsigned_long> *ppStack_190;
  pair<unsigned_long,_unsigned_long> *local_188;
  pair<unsigned_long,_unsigned_long> *ppStack_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Map_pointer local_150;
  pair<unsigned_long,_unsigned_long> *local_148;
  pair<unsigned_long,_unsigned_long> local_140;
  size_t local_130;
  unsigned_long local_128;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_120;
  size_type local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  _Map_pointer local_a0;
  pair<unsigned_long,_unsigned_long> *local_98;
  pair<unsigned_long,_unsigned_long> *local_90;
  long local_88;
  long local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1b8 = (pair<unsigned_long,_unsigned_long> *)left_nsv;
  local_1a0 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_170 = right_nsv;
  local_130 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_218,0);
  local_108 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_1c8 = comm;
  uVar8 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_108,comm);
  lVar31 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar31 != 0) {
    lVar31 = lVar31 >> 3;
    do {
      ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar32 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar31 + -1];
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar32
               ) break;
            operator_delete(ppVar14);
            ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar32)
            break;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12) {
          do {
            uVar27 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[lVar31 + -1];
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
              if (uVar27 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                            first) break;
              operator_delete(ppVar14);
              ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
              ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar27 != local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar31 + (uVar8 - 1));
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar31 + -1];
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar31 = lVar31 + -1;
    } while (lVar31 != 0);
  }
  local_58.current._M_cur = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_218._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_168,&local_58,&local_78,(allocator_type *)&local_b8);
  pvVar3 = *(void **)local_1a0;
  *(pointer *)local_1a0 =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_1a0 + 8) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_1a0 + 0x10) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3),
     local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar18 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  local_188 = (pair<unsigned_long,_unsigned_long> *)
              (((long)local_218._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_218._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_218._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_218._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_218._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x20);
  local_148 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_188 == (pair<unsigned_long,_unsigned_long> *)0x0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; pppVar15 < pppVar18; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar17;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_148;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = local_198;
  local_1c0 = in;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar32 = 0;
    ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar14 = local_148;
LAB_0012fda4:
    do {
      pppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12) {
        uVar26 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar32];
        ppVar9 = ppVar12;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
          if (uVar26 < local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar14);
            ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
            ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_0012fda4;
          }
        }
        else if (uVar26 < local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_0012fda4;
        }
      }
      while( true ) {
        uVar26 = (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar14 >>
                 4;
        puVar36 = (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar32];
        if (((long)local_218._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar9 >> 4) +
            uVar26 + ((((ulong)((long)pppVar15 -
                               (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar15 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar25 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
          ppVar25 = pppVar15[-1] + 0x20;
        }
        if (puVar36 != (pointer)ppVar25[-1].first) break;
        uVar37 = uVar26 - 1;
        if ((long)uVar26 < 1) {
          uVar26 = (long)uVar37 >> 5;
LAB_0012fea4:
          pppVar17 = pppVar15 + uVar26;
          ppVar10 = *pppVar17;
          ppVar12 = ppVar10 + uVar37 + uVar26 * -0x20;
        }
        else {
          if (0x20 < uVar26) {
            uVar26 = uVar37 >> 5;
            goto LAB_0012fea4;
          }
          ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar17 = pppVar15;
          ppVar10 = ppVar14;
        }
        if (ppVar12 == ppVar10) {
          ppVar12 = pppVar17[-1] + 0x20;
        }
        if (puVar36 != (pointer)ppVar12[-1].first) break;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
          operator_delete(ppVar14);
          pppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
          ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar15;
        }
        else {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar32 + uVar8);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar36;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = (unsigned_long)puVar36;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar32 = uVar32 + 1;
      ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (uVar32 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar7 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar6 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar25 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar32 = (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar39 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_198 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_150 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_a0 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_1a0,*(undefined8 *)(local_1a0 + 8));
  pppVar18 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_128 = (local_218._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar31 = ((long)ppVar25 - (long)local_198 >> 4) + ((long)ppVar6 - (long)ppVar7 >> 4) +
           (((uVar32 >> 3) - 1) + (ulong)bVar39) * 0x20;
  ppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_1c8;
  if (lVar31 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; local_198 = ppVar14, local_1c8 = comm_00, pppVar15 < pppVar18; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar14 = local_198;
    comm_00 = local_1c8;
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar17;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar31 + (long)local_188 != *(long *)(local_1a0 + 8) - *(long *)local_1a0 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 0, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_168,&local_128,1,comm_00);
  local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8,(long)comm_00->m_size,(value_type_conflict *)&local_d0,
             (allocator_type *)&local_100);
  local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d0,(long)comm_00->m_size,(value_type_conflict *)&local_100,
             (allocator_type *)&local_e8);
  comm_01 = local_1c8;
  uVar1 = comm_00->m_rank;
  lVar31 = (long)(int)uVar1;
  if (0 < lVar31) {
    uVar32 = *(ulong *)((long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar31 * 8 + -8);
    lVar38 = lVar31;
    uVar27 = 0;
    do {
      lVar24 = lVar38 + -1;
      ppVar14 = (pair<unsigned_long,_unsigned_long> *)(uVar27 + 1);
      if (uVar27 + 1 < local_188) {
        ppVar14 = local_188;
      }
      uVar26 = *(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar38 * 8 + -8);
      puVar29 = (ulong *)(uVar27 * 0x10 + *(long *)local_1a0);
      uVar20 = uVar27 - 1;
      do {
        uVar28 = (long)ppVar14 - 1;
        if (uVar20 + (1 - (long)ppVar14) == -1) break;
        uVar28 = uVar20 + 1;
        uVar37 = *puVar29;
        puVar29 = puVar29 + 2;
        uVar20 = uVar28;
      } while (uVar26 <= uVar37);
      if (uVar26 <= uVar32) {
        *(unsigned_long *)
         ((long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar24 * 8) = (uVar28 - uVar27) + 1;
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] = uVar27;
        uVar32 = uVar26;
        if (*(ulong *)((long)local_168.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar24 * 8) < local_128)
        break;
      }
      bVar39 = 1 < lVar38;
      lVar38 = lVar24;
      uVar27 = uVar28;
    } while (bVar39);
  }
  iVar2 = local_1c8->m_size;
  if ((int)uVar1 < iVar2 + -1) {
    lVar38 = *(long *)local_1a0;
    uVar22 = *(long *)(local_1a0 + 8) - lVar38 >> 4;
    uVar26 = ((unsigned_long *)
             ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar31];
    local_198 = (pair<unsigned_long,_unsigned_long> *)
                local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar32 = lVar31 + 1;
    uVar30 = (ulong)uVar1;
    uVar37 = uVar22 - 1;
    do {
      uVar34 = uVar37;
      if ((int)uVar1 < (int)uVar30) {
        uVar30 = uVar37 + 1;
        if (uVar37 + 1 < uVar22) {
          uVar30 = uVar22;
        }
        puVar29 = (ulong *)(uVar37 * 0x10 + lVar38 + 0x10);
        uVar33 = uVar37 - 1;
        do {
          uVar34 = uVar30 - 1;
          if (uVar22 <= uVar33 + 2) break;
          uVar34 = uVar33 + 1;
          uVar4 = *puVar29;
          puVar29 = puVar29 + 2;
          uVar33 = uVar34;
        } while (uVar4 <= uVar26);
      }
      uVar30 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar32];
      ppVar14 = (pair<unsigned_long,_unsigned_long> *)uVar37;
      if (local_188 < uVar37) {
        puVar29 = (ulong *)(uVar37 * 0x10 + lVar38);
        do {
          ppVar14 = (pair<unsigned_long,_unsigned_long> *)uVar37;
          if (*puVar29 < uVar30) break;
          uVar37 = uVar37 - 1;
          puVar29 = puVar29 + -2;
          ppVar14 = local_188;
        } while (local_188 < uVar37);
      }
      if (uVar30 <= uVar26) {
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar32] = (uVar34 - (long)ppVar14) + 1;
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar32] = (unsigned_long)ppVar14;
        uVar26 = uVar30;
        if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar32] < local_128) break;
      }
      uVar30 = uVar32 & 0xffffffff;
      uVar32 = uVar32 + 1;
      uVar37 = (ulong)ppVar14;
    } while (iVar2 != (int)uVar32);
  }
  mxx::all2all<unsigned_long>(&local_100,&local_b8,local_1c8);
  mxx::impl::get_displacements<unsigned_long>(&local_e8,&local_100);
  uVar27 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar20 = local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_120,(size_type)(uVar27 + uVar20),(allocator_type *)&local_140);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_1a0,&local_b8,&local_d0,
             local_120.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_100,&local_e8,comm_01);
  local_1c8 = (comm *)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[comm_01->m_rank];
  local_90 = (pair<unsigned_long,_unsigned_long> *)(uVar27 + uVar20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,local_108);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_170,local_108);
  pppVar18 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_180 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pvVar35 = local_1c0;
  for (pppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_node; local_1c0 = pvVar35,
      pppVar15 < pppVar18; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    pvVar35 = local_1c0;
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar17;
  lVar31 = (long)(pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_180;
  if (lVar31 != 0) {
    lVar31 = lVar31 >> 3;
    local_188 = (pair<unsigned_long,_unsigned_long> *)(uVar8 - 1);
    do {
      uVar27 = (long)&local_188->first + lVar31;
      lVar31 = lVar31 + -1;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar36 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar32 = puVar36[lVar31];
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar12[0x1f].first <= uVar32) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar12[0x1f].second - uVar8] = uVar27;
            ppVar9 = ppVar12 + 0x20;
          }
          else {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar32)
            break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] = uVar27;
            ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar20 = ppVar9[-1].first;
          uVar28 = ppVar9[-1].second;
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14)
          goto LAB_0013051e;
          while( true ) {
            operator_delete(ppVar14);
            ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_218._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0013055a;
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) break;
              if (uVar20 != local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_00130551;
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
              _M_impl).super__Vector_impl_data._M_start
              [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] =
                   uVar28;
LAB_0013051e:
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar20 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
                 uVar28;
          }
LAB_00130551:
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_218._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        } while( true );
      }
LAB_0013055a:
      pvVar35 = local_1c0;
      local_140.first =
           (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar31];
      local_140.second = uVar27;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,&local_140);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_140.first;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar27;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar31 != 0);
  }
  ppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_1c8 != (comm *)0x0) {
    local_98 = (pair<unsigned_long,_unsigned_long> *)
               ((long)&((pair<unsigned_long,_unsigned_long> *)((long)local_1c8 + -0x10))->second + 7
               );
    local_88 = (long)local_1c8 * 0x10 + -0x10;
    ppVar19 = (pair<unsigned_long,_unsigned_long> *)0x0;
    ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
LAB_001305ef:
    if (ppVar10 != ppVar14) {
      lVar31 = (long)&local_1c8->_vptr_comm + ~(ulong)ppVar19;
      local_80 = lVar31 * 0x10;
      local_198 = (pair<unsigned_long,_unsigned_long> *)
                  local_120.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar31].second;
      local_188 = local_120.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar31;
      ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_148 = ppVar19;
LAB_0013063d:
      if (ppVar10 == ppVar16) {
        ppVar19 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar19[0x1f].first <= local_188->first) goto LAB_001307ae;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar19[0x1f].second - uVar8] = (unsigned_long)local_198;
        uVar27 = ppVar19[0x1f].first;
        uVar20 = ppVar19[0x1f].second;
        operator_delete(ppVar16);
        ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
        ppVar10 = ppVar16 + 0x1f;
        ppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar10[-1].first <= local_188->first) goto LAB_001307ae;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar10[-1].second - uVar8] = (unsigned_long)local_198;
        uVar27 = ppVar10[-1].first;
        uVar20 = ppVar10[-1].second;
        ppVar10 = ppVar10 + -1;
      }
      ppVar12 = ppVar10;
      local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
      if (ppVar10 != ppVar14) {
        do {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
          if (ppVar10 == ppVar16) {
            if (uVar27 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_0013079d;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
                 uVar20;
            operator_delete(ppVar16);
            ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
            ppVar10 = ppVar16 + 0x1f;
            ppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar27 != ppVar10[-1].first) goto LAB_0013079d;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar10[-1].second - uVar8] = uVar20;
            ppVar10 = ppVar10 + -1;
          }
          ppVar12 = ppVar10;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
          if (ppVar10 == ppVar14) break;
        } while( true );
      }
      goto LAB_001307ae;
    }
  }
LAB_00130927:
  pppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  local_198 = (pair<unsigned_long,_unsigned_long> *)
              local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (ppVar12 != ppVar14) {
    local_188 = (pair<unsigned_long,_unsigned_long> *)
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)
                ->_M_impl).super__Vector_impl_data._M_start;
    pppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00130968:
    puVar36 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
              _M_impl).super__Vector_impl_data._M_start;
    pppVar18 = pppVar17;
    ppVar10 = ppVar12;
    ppVar19 = ppVar9;
    do {
      uVar37 = (long)ppVar10 - (long)ppVar19 >> 4;
      uVar32 = uVar37 - 1;
      uVar30 = (long)uVar32 >> 5;
      uVar26 = uVar30;
      if ((long)uVar37 < 1) {
LAB_0013099f:
        ppVar16 = pppVar18[uVar26] + uVar32 + uVar26 * -0x20;
      }
      else {
        if (0x20 < uVar37) {
          uVar26 = uVar32 >> 5;
          goto LAB_0013099f;
        }
        ppVar16 = ppVar10 + -1;
      }
      if (ppVar16 == ppVar14) goto LAB_00130a69;
      ppVar16 = ppVar12;
      if (ppVar12 == ppVar9) {
        ppVar16 = pppVar17[-1] + 0x20;
      }
      if ((long)uVar37 < 1) {
LAB_001309f3:
        pppVar21 = pppVar18 + uVar30;
        ppVar23 = *pppVar21;
        ppVar11 = ppVar23 + uVar32 + uVar30 * -0x20;
      }
      else {
        if (0x20 < uVar37) {
          uVar30 = uVar32 >> 5;
          goto LAB_001309f3;
        }
        ppVar11 = ppVar10 + -1;
        pppVar21 = pppVar18;
        ppVar23 = ppVar19;
      }
      if (ppVar11 == ppVar23) {
        ppVar11 = pppVar21[-1] + 0x20;
      }
      if (ppVar16[-1].first != ppVar11[-1].first) goto LAB_00130a69;
      if (ppVar10 == ppVar19) {
        ppVar19 = pppVar18[-1];
        pppVar18 = pppVar18 + -1;
        ppVar10 = ppVar19 + 0x20;
      }
      ppVar16 = ppVar12;
      if (ppVar12 == ppVar9) {
        ppVar16 = pppVar17[-1] + 0x20;
      }
      ppVar10 = ppVar10 + -1;
      ppVar11 = ppVar10;
      if (ppVar10 == ppVar19) {
        ppVar11 = pppVar18[-1] + 0x20;
      }
      puVar36[ppVar11[-1].second - uVar8] = ppVar16[-1].second;
    } while( true );
  }
LAB_00130abf:
  local_1b8 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_1b0 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_218._M_impl.super__Deque_impl_data._M_start._M_node <
      local_218._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      pppVar18 = pppVar17 + 1;
      operator_delete(pppVar17[1]);
      pppVar17 = pppVar18;
    } while (pppVar18 < local_198);
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_1b8;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_1b0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar15;
  puVar36 = (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  if ((pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar36) {
    uVar32 = 0;
    do {
      uVar27 = uVar32 + uVar8;
      ppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <=
                puVar36[uVar32]) break;
            (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
                 uVar27;
            operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            ppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar36[uVar32]) break;
            (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] = uVar27;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14);
        puVar36 = (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      local_140.first = puVar36[uVar32];
      local_140.second = uVar27;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,&local_140);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_140.first;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar27;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar32 = uVar32 + 1;
      puVar36 = (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar32 < (ulong)((long)(local_1c0->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar36 >> 3
                             ));
  }
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if ((comm *)local_90 != local_1c8) {
    lVar31 = (long)local_90 - (long)local_1c8;
    lVar38 = 0;
    local_1c8 = (comm *)((long)local_1c8 << 4);
    do {
      if (ppVar14 == ppVar12) break;
      puVar5 = &(local_120.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar10 = (pair<unsigned_long,_unsigned_long> *)((long)local_1c8 + lVar38 * 0x10);
      uVar27 = *(unsigned_long *)
                ((long)&((pair<unsigned_long,_unsigned_long> *)((long)local_1c8 + lVar38 * 0x10))->
                        second + (long)puVar5);
      do {
        uVar32 = *(ulong *)((long)&ppVar10->first + (long)puVar5);
        if (ppVar14 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar32)
          break;
          (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
               uVar27;
          operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar14[-1].first <= uVar32) break;
          (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar14[-1].second - uVar8] = uVar27;
          ppVar14 = ppVar14 + -1;
        }
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
      } while (ppVar14 != ppVar12);
      lVar38 = lVar38 + 1;
    } while (lVar38 != lVar31 + (ulong)(lVar31 == 0));
  }
  if (ppVar14 != ppVar12) {
    puVar36 = (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar14 == ppVar10) {
        ppVar10 = pppVar15[-1];
        pppVar15 = pppVar15 + -1;
        puVar36[ppVar10[0x1f].second - uVar8] = local_130;
        ppVar14 = ppVar10 + 0x20;
      }
      else {
        puVar36[ppVar14[-1].second - uVar8] = local_130;
      }
      ppVar14 = ppVar14 + -1;
    } while (ppVar14 != ppVar12);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_1a0,&local_120);
  if (local_120.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_120.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pair<unsigned_long,_unsigned_long> *)
      local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pair<unsigned_long,_unsigned_long> *)
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_218);
  return;
LAB_0013079d:
  ppVar12 = ppVar10;
  if (ppVar10 == ppVar14) goto LAB_001307ae;
  goto LAB_0013063d;
LAB_001307ae:
  pvVar35 = local_1c0;
  ppVar19 = local_148;
  if (ppVar10 != ppVar14) {
    ppVar16 = ppVar10;
    if (ppVar10 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&(local_120.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + local_80) == ppVar16[-1].first
       ) {
      ppVar10 = ppVar12;
      if (lVar31 != 0) {
        plVar13 = (long *)((long)&local_120.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-(long)local_148].first
                          + local_88);
        ppVar12 = local_148;
        do {
          ppVar19 = ppVar12;
          if (*plVar13 != plVar13[-2]) goto LAB_00130834;
          ppVar12 = (pair<unsigned_long,_unsigned_long> *)((long)&ppVar12->first + 1);
          plVar13 = plVar13 + -2;
          lVar31 = lVar31 + -1;
          ppVar19 = local_98;
        } while (lVar31 != 0);
      }
      lVar31 = 0;
LAB_00130834:
      ppVar12 = ppVar10;
      if (ppVar10 != ppVar14) {
        if (ppVar10 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first !=
              local_120.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar31].first) goto LAB_00130916;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
          _M_impl).super__Vector_impl_data._M_start
          [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
               local_120.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar31].second;
          operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar10[-1].first !=
              local_120.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar31].first) goto LAB_00130916;
          ppVar12 = ppVar10 + -1;
          ppVar10 = ppVar10 + -1;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar12->second - uVar8] =
               local_120.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar31].second;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
        }
        goto LAB_00130834;
      }
    }
  }
LAB_00130916:
  ppVar19 = (pair<unsigned_long,_unsigned_long> *)((long)&ppVar19->first + 1);
  if (local_1c8 <= ppVar19) goto LAB_00130927;
  goto LAB_001305ef;
LAB_00130a69:
  if (ppVar12 == ppVar9) {
    ppVar12 = pppVar17[-1] + 0x20;
  }
  *(size_t *)((long)local_188 + (ppVar12[-1].second - uVar8) * 8) = local_130;
  if (ppVar10 == ppVar19) {
    ppVar19 = pppVar18[-1];
    pppVar18 = pppVar18 + -1;
    ppVar10 = ppVar19 + 0x20;
  }
  ppVar12 = ppVar10 + -1;
  pppVar17 = pppVar18;
  ppVar9 = ppVar19;
  pvVar35 = local_1c0;
  if (ppVar12 == ppVar14) goto LAB_00130abf;
  goto LAB_00130968;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}